

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::copy_cut_border
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,Allocator *allocator,
               int num_threads)

{
  int iVar1;
  bool bVar2;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  Mat cutm;
  Mat m;
  int q;
  int channels;
  size_t elemsize;
  int h;
  int w;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  Mat *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  Mat *in_stack_ffffffffffffff70;
  int local_38;
  
  if (((*(int *)(in_RDI + 0x24) - in_R8D) - in_R9D == *(int *)(in_RDI + 0x24)) &&
     ((*(int *)(in_RDI + 0x28) - in_EDX) - in_ECX == *(int *)(in_RDI + 0x28))) {
    Mat::operator=(in_stack_ffffffffffffff58,
                   (Mat *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  else if (*(int *)(in_RDI + 0x20) == 2) {
    Mat::create(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                (Allocator *)in_stack_ffffffffffffff58);
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (!bVar2) {
      copy_cut_border_image
                (in_stack_ffffffffffffff70,
                 (Mat *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    }
  }
  else if (*(int *)(in_RDI + 0x20) == 3) {
    iVar1 = *(int *)(in_RDI + 0x2c);
    Mat::create(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                in_stack_ffffffffffffff64,(size_t)in_stack_ffffffffffffff58,
                (Allocator *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (!bVar2) {
      for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
        Mat::channel(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
        Mat::channel(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
        copy_cut_border_image
                  (in_stack_ffffffffffffff70,
                   (Mat *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
        Mat::~Mat((Mat *)0x15a33d);
        Mat::~Mat((Mat *)0x15a347);
      }
    }
  }
  return;
}

Assistant:

void copy_cut_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, Allocator* allocator, int num_threads)
{
    int w = src.w - left - right;
    int h = src.h - top - bottom;
    size_t elemsize = src.elemsize;

    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    if (src.dims == 2)
    {
        dst.create(w, h, elemsize, allocator);
        if (dst.empty())
            return;

        copy_cut_border_image(src, dst, top, left);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels, elemsize, allocator);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for num_threads(num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat cutm = dst.channel(q);

            copy_cut_border_image(m, cutm, top, left);
        }
    }
}